

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O3

Image<float,_gimage::PixelTraits<float>_> *
gimage::cropImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,long x,long y,long w,long h)

{
  float ***pppfVar1;
  long lVar2;
  float ***pppfVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  
  lVar5 = 0;
  if (0 < w) {
    lVar5 = w;
  }
  lVar6 = 0;
  if (0 < h) {
    lVar6 = h;
  }
  iVar4 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (float *)0x0;
  __return_storage_ptr__->row = (float **)0x0;
  __return_storage_ptr__->img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(__return_storage_ptr__,lVar5,lVar6,(long)iVar4)
  ;
  if ((((y | x) < 0) || (image->width < lVar5 + x)) || (image->height < lVar6 + y)) {
    iVar4 = image->depth;
    if (0 < (long)iVar4) {
      lVar5 = 0;
      do {
        if (0 < h) {
          pppfVar1 = __return_storage_ptr__->img;
          lVar6 = 0;
          do {
            if (0 < w) {
              lVar10 = lVar6 + y;
              lVar2 = image->width;
              pppfVar3 = image->img;
              pfVar7 = pppfVar1[lVar5][lVar6];
              lVar8 = x;
              lVar9 = w;
              do {
                fVar11 = INFINITY;
                if (((-1 < lVar8) && (fVar11 = INFINITY, -1 < lVar10)) &&
                   ((fVar11 = INFINITY, lVar8 < lVar2 && (fVar11 = INFINITY, lVar10 < image->height)
                    ))) {
                  fVar11 = pppfVar3[lVar5][lVar10][lVar8];
                }
                *pfVar7 = fVar11;
                lVar8 = lVar8 + 1;
                pfVar7 = pfVar7 + 1;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != h);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != iVar4);
    }
  }
  else {
    iVar4 = image->depth;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        if (0 < h) {
          lVar10 = 0;
          do {
            memcpy(__return_storage_ptr__->img[lVar6][lVar10],image->img[lVar6][y + lVar10] + x,
                   lVar5 << 2);
            lVar10 = lVar10 + 1;
          } while (h != lVar10);
          iVar4 = image->depth;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}